

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O2

int64_t __thiscall
anon_unknown.dwarf_1cee2::OpenGLGraphicsPlugin::SelectColorSwapchainFormat
          (OpenGLGraphicsPlugin *this,vector<long,_std::allocator<long>_> *runtimeFormats)

{
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var1;
  int64_t SupportedColorSwapchainFormats [4];
  allocator local_49;
  long local_48 [4];
  string local_28;
  
  local_48[2] = 0x8058;
  local_48[3] = 0x8f97;
  local_48[0] = 0x8059;
  local_48[1] = 0x881a;
  _Var1 = std::
          find_first_of<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long_const*>
                    ((__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
                     (runtimeFormats->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
                     (runtimeFormats->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_finish,local_48,(long *)&local_28);
  if (_Var1._M_current !=
      (runtimeFormats->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return *_Var1._M_current;
  }
  std::__cxx11::string::string
            ((string *)&local_28,"No runtime swapchain format supported for color swapchain",
             &local_49);
  Throw(&local_28,(char *)0x0,
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:246"
       );
}

Assistant:

int64_t SelectColorSwapchainFormat(const std::vector<int64_t>& runtimeFormats) const override {
        // List of supported color swapchain formats.
        constexpr int64_t SupportedColorSwapchainFormats[] = {
            GL_RGB10_A2,
            GL_RGBA16F,
            // The two below should only be used as a fallback, as they are linear color formats without enough bits for color
            // depth, thus leading to banding.
            GL_RGBA8,
            GL_RGBA8_SNORM,
        };

        auto swapchainFormatIt =
            std::find_first_of(runtimeFormats.begin(), runtimeFormats.end(), std::begin(SupportedColorSwapchainFormats),
                               std::end(SupportedColorSwapchainFormats));
        if (swapchainFormatIt == runtimeFormats.end()) {
            THROW("No runtime swapchain format supported for color swapchain");
        }

        return *swapchainFormatIt;
    }